

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

predictor * __thiscall
Search::predictor::add_condition_range(predictor *this,ptag hi,ptag count,char name0)

{
  uint uVar1;
  int iVar2;
  char name;
  char local_3d;
  ptag local_3c;
  predictor *local_38;
  
  local_38 = this;
  if (count != 0) {
    uVar1 = count - 1;
    if (hi < count - 1) {
      uVar1 = hi;
    }
    iVar2 = uVar1 + 1;
    do {
      local_3d = name0;
      local_3c = hi;
      v_array<unsigned_int>::push_back(&this->condition_on_tags,&local_3c);
      v_array<char>::push_back(&this->condition_on_names,&local_3d);
      hi = hi - 1;
      name0 = name0 + '\x01';
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return local_38;
}

Assistant:

predictor& predictor::add_condition_range(ptag hi, ptag count, char name0)
{
  if (count == 0)
    return *this;
  for (ptag i = 0; i < count; i++)
  {
    if (i > hi)
      break;
    char name = name0 + i;
    condition_on_tags.push_back(hi - i);
    condition_on_names.push_back(name);
  }
  return *this;
}